

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::name2dataaddress(Forth *this)

{
  pointer plVar1;
  char cVar2;
  pointer plVar3;
  bool bVar4;
  pointer plVar5;
  size_type __n;
  uint uVar6;
  uint src;
  int iVar7;
  size_t sVar8;
  string *__range3;
  char cVar9;
  ForthStack<unsigned_int> *this_00;
  _Alloc_hider __s2;
  string localName;
  string local_58;
  ForthStack<unsigned_int> *local_38;
  
  requireDStackAvailable(this,1,"BL");
  this_00 = &this->dStack;
  iVar7 = 0x20;
  ForthStack<unsigned_int>::push(this_00,0x20);
  word(this);
  if ((this->localVariables).
      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->localVariables).
      super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dup(this,iVar7);
    count(this);
    uVar6 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    src = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    moveFromDataSpace(this,&local_58,src,(ulong)uVar6);
    __n = local_58._M_string_length;
    __s2._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_string_length != 0) {
      sVar8 = 0;
      do {
        cVar2 = local_58._M_dataplus._M_p[sVar8];
        cVar9 = cVar2 + -0x20;
        if (0x19 < (byte)(cVar2 + 0x9fU)) {
          cVar9 = cVar2;
        }
        local_58._M_dataplus._M_p[sVar8] = cVar9;
        sVar8 = sVar8 + 1;
      } while (local_58._M_string_length != sVar8);
    }
    plVar3 = (this->localVariables).
             super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar1 = (this->localVariables).
             super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      plVar5 = plVar1;
      if (plVar5 == plVar3) {
        bVar4 = true;
        goto LAB_00115407;
      }
      plVar1 = plVar5 + -1;
      local_38 = this_00;
    } while ((plVar5[-1].localName._M_string_length != __n) ||
            ((__n != 0 &&
             (iVar7 = bcmp((plVar1->localName)._M_dataplus._M_p,__s2._M_p,__n), this_00 = local_38,
             iVar7 != 0))));
    this_00 = local_38;
    ForthStack<unsigned_int>::setTop(local_38,plVar5[-1].localAddress);
    bVar4 = false;
    __s2._M_p = local_58._M_dataplus._M_p;
LAB_00115407:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s2._M_p != &local_58.field_2) {
      operator_delete(__s2._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar4) {
      return;
    }
  }
  find(this);
  requireDStackDepth(this,1,"DROP");
  ForthStack<unsigned_int>::pop(this_00);
  toBody(this);
  return;
}

Assistant:

void name2dataaddress(){
			bl();word();
			if(localVariables.size()>0){
				dup();
				count();
				auto u=dStack.getTop(); dStack.pop();
				auto address=dStack.getTop(); dStack.pop();
				std::string localName{};
				moveFromDataSpace(localName,address,u);
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.rbegin(),itEnd=localVariables.rend();it!=itEnd;++it){
					if((*it).localName==localName){
						dStack.setTop((*it).localAddress);
						return;
					}
				}		
			} 
			find();drop();toBody();
			
		}